

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O3

void __thiscall
CheckedTimedMutexTest_RecurseTryLockUntil_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedTimedMutexTest_RecurseTryLockUntil_Test<yamc::checked::timed_mutex> *this)

{
  bool *pbVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  StringLike<const_char_*> *regex;
  element_type *peVar6;
  DeathTest *gtest_dt;
  TypeParam mtx;
  element_type *local_f8;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_f0;
  undefined8 uStack_d8;
  AssertHelper local_c8 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a8;
  mutex_base local_90;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)&local_90);
  pbVar1 = &local_f0.impl_.full_match_;
  local_f0.impl_.full_match_ = false;
  local_f0.impl_._17_7_ = 0;
  uStack_d8 = 0;
  local_f0.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::mutex_base::lock(&local_90);
  }
  if (local_f0.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_f0.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_c8[0].data_ = (AssertHelperData *)0x1cec69;
    testing::ContainsRegex<char_const*>(&local_f0,(testing *)local_c8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a8,(PolymorphicMatcher *)&local_f0);
    if (local_f0.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("mtx.try_lock_until(std::chrono::system_clock::now())",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0xf1,(DeathTest **)&local_f8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a8);
    peVar6 = local_f8;
    if (!bVar3) goto LAB_00186e8e;
    if (local_f8 == (element_type *)0x0) goto LAB_00186ee4;
    iVar4 = (**(code **)(local_f8->pattern_ + 0x10))(local_f8);
    peVar2 = local_f8;
    if (iVar4 == 0) {
      testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_f0,6);
      iVar4 = (**(code **)(local_f8->pattern_ + 0x18))();
      bVar3 = testing::KilledBySignal::operator()((KilledBySignal *)&local_f0,iVar4);
      iVar4 = (**(code **)(peVar2->pattern_ + 0x20))(peVar2,(ulong)bVar3);
      if ((char)iVar4 == '\0') {
        (**(code **)(peVar6->pattern_ + 8))(peVar6);
        goto LAB_00186e8e;
      }
    }
    else if (iVar4 == 1) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        local_f0.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)std::chrono::_V2::system_clock::now();
        yamc::checked::timed_mutex::
        do_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                  ((timed_mutex *)&local_90,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&local_f0,"recursive try_lock_until");
      }
      (**(code **)(local_f8->pattern_ + 0x28))(local_f8,2);
      (**(code **)(peVar2->pattern_ + 0x28))(peVar2,0);
    }
    pcVar5 = peVar6->pattern_;
  }
  else {
LAB_00186e8e:
    testing::Message::Message((Message *)&local_f0);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xf1,pcVar5);
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    if (local_f0.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_00186ee4;
    pcVar5 = (local_f0.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             pattern_;
    peVar6 = local_f0.impl_.regex_.
             super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (**(code **)(pcVar5 + 8))(peVar6);
LAB_00186ee4:
  local_f0.impl_.full_match_ = false;
  local_f0.impl_._17_7_ = 0;
  uStack_d8 = 0;
  local_f0.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::mutex_base::unlock(&local_90);
  }
  if (local_f0.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_f0.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  yamc::checked::timed_mutex::~timed_mutex((timed_mutex *)&local_90);
  return;
}

Assistant:

TYPED_TEST(CheckedTimedMutexTest, RecurseTryLockUntil) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  EXPECT_CHECK_FAILURE(mtx.try_lock_until(std::chrono::system_clock::now()));
  ASSERT_NO_THROW(mtx.unlock());
}